

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ITokenizer.cc
# Opt level: O2

void onmt::write_tokens(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *tokens,vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                *features,ostream *os,string *tokens_delimiter)

{
  pointer pvVar1;
  ostream *poVar2;
  pointer pvVar3;
  ulong uVar4;
  pointer pbVar5;
  long lVar6;
  size_t j;
  ulong uVar7;
  
  for (uVar4 = 0;
      pbVar5 = (tokens->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(tokens->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5);
      uVar4 = uVar4 + 1) {
    if (uVar4 != 0) {
      std::operator<<(os,(string *)tokens_delimiter);
      pbVar5 = (tokens->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    }
    std::operator<<(os,(string *)(pbVar5 + uVar4));
    pvVar3 = (features->
             super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar1 = (features->
             super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pvVar3 != pvVar1) {
      lVar6 = 0;
      for (uVar7 = 0; uVar7 < (ulong)(((long)pvVar1 - (long)pvVar3) / 0x18); uVar7 = uVar7 + 1) {
        poVar2 = std::operator<<(os,(string *)ITokenizer::feature_marker_abi_cxx11_);
        std::operator<<(poVar2,(string *)
                               (*(long *)((long)&(((features->
                                                                                                      
                                                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 )._M_impl.super__Vector_impl_data + lVar6) +
                               uVar4 * 0x20));
        pvVar3 = (features->
                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pvVar1 = (features->
                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        lVar6 = lVar6 + 0x18;
      }
    }
  }
  return;
}

Assistant:

void write_tokens(const std::vector<std::string>& tokens,
                    const std::vector<std::vector<std::string>>& features,
                    std::ostream& os,
                    const std::string& tokens_delimiter)
  {
    for (size_t i = 0; i < tokens.size(); ++i)
    {
      if (i > 0)
        os << tokens_delimiter;
      os << tokens[i];

      if (!features.empty())
      {
        for (size_t j = 0; j < features.size(); ++j)
          os << ITokenizer::feature_marker << features[j][i];
      }
    }
  }